

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1482a::TestCheckCloseWithDoublesSucceeds::RunImpl
          (TestCheckCloseWithDoublesSucceeds *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  double local_40;
  double local_38;
  double local_30;
  TestDetails local_28;
  
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  local_30 = 0.5;
  local_38 = 0.5;
  local_40 = 0.0001;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar2,0x10e);
  UnitTest::CheckClose<double,double,double>(results,&local_30,&local_38,&local_40,&local_28);
  return;
}

Assistant:

TEST(CheckCloseWithDoublesSucceeds)
{
    CHECK_CLOSE(0.5, 0.5, 0.0001);
}